

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# irrArray.h
# Opt level: O0

void __thiscall
irr::core::array<irr::core::string<unsigned_short>_>::reallocate
          (array<irr::core::string<unsigned_short>_> *this,u32 new_size)

{
  string<unsigned_short> *psVar1;
  undefined1 auVar2 [16];
  ulong uVar3;
  ulong uVar4;
  ulong *puVar5;
  string<unsigned_short> *psVar6;
  ulong uVar7;
  u32 local_74;
  string<unsigned_short> *local_60;
  int local_34;
  s32 i;
  s32 end;
  string<unsigned_short> *old_data;
  u32 new_size_local;
  array<irr::core::string<unsigned_short>_> *this_local;
  
  psVar1 = this->data;
  uVar3 = CONCAT44(0,new_size);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = uVar3;
  uVar4 = SUB168(auVar2 * ZEXT816(0x10),0);
  uVar7 = uVar4 + 8;
  if (SUB168(auVar2 * ZEXT816(0x10),8) != 0 || 0xfffffffffffffff7 < uVar4) {
    uVar7 = 0xffffffffffffffff;
  }
  puVar5 = (ulong *)operator_new__(uVar7);
  *puVar5 = uVar3;
  psVar6 = (string<unsigned_short> *)(puVar5 + 1);
  if (uVar3 != 0) {
    local_60 = psVar6;
    do {
      string<unsigned_short>::string(local_60);
      local_60 = local_60 + 1;
    } while (local_60 != psVar6 + uVar3);
  }
  this->data = psVar6;
  this->allocated = new_size;
  local_74 = new_size;
  if (this->used < new_size) {
    local_74 = this->used;
  }
  for (local_34 = 0; local_34 < (int)local_74; local_34 = local_34 + 1) {
    string<unsigned_short>::operator=(this->data + local_34,psVar1 + local_34);
  }
  if (this->allocated < this->used) {
    this->used = this->allocated;
  }
  if (psVar1 != (string<unsigned_short> *)0x0) {
    psVar6 = psVar1 + *(long *)&psVar1[-1].allocated;
    while (psVar1 != psVar6) {
      psVar6 = psVar6 + -1;
      string<unsigned_short>::~string(psVar6);
    }
    operator_delete__(&psVar1[-1].allocated);
  }
  return;
}

Assistant:

void reallocate(u32 new_size)
	{
		T* old_data = data;

		data = new T[new_size];
		allocated = new_size;
		
		s32 end = used < new_size ? used : new_size;
		for (s32 i=0; i<end; ++i)
			data[i] = old_data[i];

		if (allocated < used)
			used = allocated;
		
		delete [] old_data;
	}